

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O2

int Gia_ManFactorGraph(Gia_Man_t *p,Dec_Graph_t *pFForm,Vec_Int_t *vLeaves)

{
  Dec_Node_t *pDVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 8;
  lVar3 = 0;
  while( true ) {
    if (pFForm->nLeaves <= lVar3) {
      iVar2 = Gia_ManGraphToAig(p,pFForm);
      return iVar2;
    }
    pDVar1 = pFForm->pNodes;
    iVar2 = Vec_IntEntry(vLeaves,(int)lVar3);
    if (iVar2 < 0) break;
    iVar2 = Vec_IntEntry(vLeaves,(int)lVar3);
    *(int *)(&(pDVar1->eEdge0).field_0x0 + lVar4) = iVar2;
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x18;
  }
  __assert_fail("Vec_IntEntry(vLeaves, i) >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                ,0x6a,"int Gia_ManFactorGraph(Gia_Man_t *, Dec_Graph_t *, Vec_Int_t *)");
}

Assistant:

int Gia_ManFactorGraph( Gia_Man_t * p, Dec_Graph_t * pFForm, Vec_Int_t * vLeaves )
{
    Dec_Node_t * pFFNode;
    int i, Lit;
    // assign fanins
    Dec_GraphForEachLeaf( pFForm, pFFNode, i )
    {
        assert( Vec_IntEntry(vLeaves, i) >= 0 );
        pFFNode->iFunc = Vec_IntEntry(vLeaves, i);
    }
    // perform strashing
    Lit = Gia_ManGraphToAig( p, pFForm );
    return Lit;
}